

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

void __thiscall MetaSim::Event::action(Event *this)

{
  _Deque_iterator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_&,_std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_*>
  local_58;
  _Self local_38;
  
  (this->_lastTime).v = (this->_time).v;
  this->_priority = this->_std_priority;
  (*this->_vptr_Event[2])();
  local_58._M_cur =
       (this->_particles).
       super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_58._M_first._0_4_ =
       *(undefined4 *)
        &(this->_particles).
         super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_58._M_first._4_4_ =
       *(undefined4 *)
        ((long)&(this->_particles).
                super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first + 4);
  local_58._M_last._0_4_ =
       *(undefined4 *)
        &(this->_particles).
         super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_58._M_last._4_4_ =
       *(undefined4 *)
        ((long)&(this->_particles).
                super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last + 4);
  local_58._M_node =
       (this->_particles).
       super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  while (local_58._M_cur !=
         (this->_particles).
         super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    (*(((local_58._M_cur)->_M_t).
       super___uniq_ptr_impl<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
       ._M_t.
       super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
       .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl)->
      _vptr_ParticleInterface[2])();
    std::
    _Deque_iterator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_&,_std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_*>
    ::operator++(&local_38,&local_58,0);
  }
  return;
}

Assistant:

void Event::action()
    {
        DBGENTER(_EVENT_DBG_LEV);

        /* Handles the event ONLY if it has target!!! Otherwise executes
         * its tracing and calls the related stats.....
         */
        _lastTime = _time; 

        // restore old priority
        restorePriority();

        // the doit(), probe() and record() could raise
        // arbitrary exception...  hence, I can't specify the
        // exception type in the interface!
        // It may repost the event
        doit();

        // for(its = _stats.begin(); its != _stats.end(); its++)
        //     (*its)->probe(this);

        // the new way of doing statistics. The old way
        // remains valid, but it is deprecated.
        DBGPRINT_2("Calling the particle probes, size = ", 
                   _particles.size());
        for (auto itp = _particles.begin(); itp != _particles.end(); itp++) {
            DBGPRINT("Calling probe");
            (*itp)->probe();
        } 
    }